

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SOURCE_HANDLE source_clone(SOURCE_HANDLE value)

{
  AMQP_VALUE pAVar1;
  SOURCE_HANDLE local_18;
  SOURCE_INSTANCE *source_instance;
  SOURCE_HANDLE value_local;
  
  local_18 = (SOURCE_HANDLE)malloc(8);
  if (local_18 != (SOURCE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (SOURCE_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

SOURCE_HANDLE source_clone(SOURCE_HANDLE value)
{
    SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)malloc(sizeof(SOURCE_INSTANCE));
    if (source_instance != NULL)
    {
        source_instance->composite_value = amqpvalue_clone(((SOURCE_INSTANCE*)value)->composite_value);
        if (source_instance->composite_value == NULL)
        {
            free(source_instance);
            source_instance = NULL;
        }
    }

    return source_instance;
}